

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O0

void __thiscall
ktx::CommandExtract::unpackAndSave422
          (CommandExtract *this,string *filepath,bool appendExtension,VkFormat vkFormat,
          FormatDescriptor *format,uint32_t width,uint32_t height,char *data,size_t size)

{
  bool bVar1;
  byte bVar2;
  khr_df_model_e kVar3;
  uint32_t uVar4;
  sample *psVar5;
  FormatDescriptor *this_00;
  byte in_DL;
  string *in_RSI;
  FormatDescriptor *in_R8;
  uint in_R9D;
  uint in_stack_00000008;
  long in_stack_00000010;
  ulong in_stack_00000018;
  anon_class_160_20_da61d305 setPixel;
  anon_class_1_0_00000001 interpolateUV;
  FormatDescriptor *in_stack_000001b8;
  anon_class_1_0_00000001 interpolateY;
  float valueRightV;
  float valueRightU;
  float valueRightY0;
  float valueV;
  float valueU;
  float valueY1;
  float valueY0;
  float valueLeftV;
  float valueLeftU;
  float valueLeftY1;
  char *pixel1;
  char *pixel0;
  char *rawYUVBlockRight;
  char *rawYUVBlock;
  char *rawYUVBlockLeft;
  uint32_t x;
  uint32_t y;
  uint32_t blockCountX;
  vector<char,_std::allocator<char>_> unpackedData;
  float blockSize;
  float positionV;
  float positionU;
  float positionY1;
  float positionY0;
  sample *sample;
  const_iterator __end1;
  const_iterator __begin1;
  vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> *__range1;
  uint32_t vPositionX;
  uint32_t vBits;
  uint32_t vOffset;
  uint32_t uPositionX;
  uint32_t uBits;
  uint32_t uOffset;
  uint32_t y1PositionX;
  uint32_t y1Bits;
  uint32_t y1Offset;
  uint32_t y0PositionX;
  uint32_t y0Bits;
  uint32_t y0Offset;
  uint32_t channelBytes;
  uint32_t pixelBytes;
  int blockDimensionY;
  int blockDimensionX;
  uint32_t blockYUVBytes;
  FormatDescriptor unpackedFormat;
  uint precision;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  FormatDescriptor *in_stack_fffffffffffffcb0;
  allocator_type *in_stack_fffffffffffffcc0;
  vector<char,_std::allocator<char>_> *this_01;
  FormatDescriptor *in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  uint32_t in_stack_fffffffffffffcd8;
  float in_stack_fffffffffffffcdc;
  uint in_stack_fffffffffffffce0;
  float in_stack_fffffffffffffce4;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  VkFormat in_stack_fffffffffffffd1c;
  int local_2cc;
  int local_2bc;
  string local_260 [32];
  undefined1 *local_240;
  float *local_238;
  float *local_230;
  float *local_228;
  float *local_220;
  float *local_218;
  uint *local_210;
  undefined1 *local_208;
  float *local_200;
  float *local_1f8;
  float *local_1f0;
  float *local_1e8;
  float *local_1e0;
  float *local_1d8;
  uint *local_1d0;
  float *local_1c8;
  float *local_1c0;
  float *local_1b8;
  float *local_1b0;
  uint *local_1a8;
  undefined1 local_19a;
  undefined1 local_199;
  float local_198;
  float local_194;
  float local_190;
  float local_18c;
  float local_188;
  float local_184;
  float local_180;
  float local_17c;
  float local_178;
  float local_174;
  char *local_170;
  char *local_168;
  long local_160;
  long local_158;
  long local_150;
  uint local_148;
  uint local_144;
  uint local_140;
  allocator<char> local_139;
  vector<char,_std::allocator<char>_> local_138;
  float local_11c;
  float local_118;
  float local_114;
  float local_110;
  float local_10c;
  reference local_108;
  sample *local_100;
  __normal_iterator<const_FormatDescriptor::sample_*,_std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>_>
  local_f8;
  vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> *local_f0;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint32_t local_b4;
  uint local_b0;
  uint local_ac;
  uint32_t local_a8;
  FormatDescriptor local_98;
  uint local_28;
  uint local_24;
  FormatDescriptor *local_20;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_24 = in_R9D;
  local_20 = in_R8;
  kVar3 = FormatDescriptor::model((FormatDescriptor *)0x26ebd5);
  if (kVar3 != KHR_DF_MODEL_YUVSDA) {
    __assert_fail("format.model() == KHR_DF_MODEL_YUVSDA",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x227,
                  "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                 );
  }
  psVar5 = FormatDescriptor::find
                     (in_stack_fffffffffffffcc8,
                      (khr_df_model_channels_e)((ulong)in_stack_fffffffffffffcc0 >> 0x20));
  if (psVar5 == (sample *)0x0) {
    __assert_fail("format.find(KHR_DF_CHANNEL_YUVSDA_Y)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x228,
                  "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                 );
  }
  psVar5 = FormatDescriptor::find
                     (in_stack_fffffffffffffcc8,
                      (khr_df_model_channels_e)((ulong)in_stack_fffffffffffffcc0 >> 0x20));
  local_28 = ((uint)((ulong)*(undefined8 *)psVar5 >> 0x10) & 0xff) + 1;
  createFormatDescriptor
            (in_stack_fffffffffffffd1c,
             (Reporter *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  FormatDescriptor::removeLastChannel(in_stack_fffffffffffffcb0);
  local_a8 = FormatDescriptor::pixelByteCount(local_20);
  local_ac = ((uint)((ulong)*(undefined8 *)&local_20->basic >> 0x20) & 0xff) + 1;
  local_b0 = ((uint)((ulong)*(undefined8 *)&local_20->basic >> 0x28) & 0xff) + 1;
  local_b4 = FormatDescriptor::pixelByteCount(&local_98);
  local_b8 = local_b4 / 3;
  uVar4 = FormatDescriptor::sampleCount((FormatDescriptor *)0x26ed97);
  if (uVar4 != 4) {
    __assert_fail("format.sampleCount() == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x23a,
                  "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                 );
  }
  if (((uint)((ulong)*(undefined8 *)&local_20->basic >> 0x20) & 0xff) != 1) {
    __assert_fail("format.basic.texelBlockDimension0 + 1 == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x23b,
                  "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                 );
  }
  if (((uint)((ulong)*(undefined8 *)&local_20->basic >> 0x28) & 0xff) != 0) {
    __assert_fail("format.basic.texelBlockDimension1 + 1 == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x23c,
                  "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                 );
  }
  if (((undefined1  [16])local_20->basic & (undefined1  [16])0xff000000000000) !=
      (undefined1  [16])0x0) {
    __assert_fail("format.basic.texelBlockDimension2 + 1 == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x23d,
                  "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                 );
  }
  if ((char)((ulong)*(undefined8 *)&local_20->basic >> 0x38) != '\0') {
    __assert_fail("format.basic.texelBlockDimension3 + 1 == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x23e,
                  "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                 );
  }
  if (in_stack_00000018 ==
      ((ulong)(local_24 * in_stack_00000008 * local_a8) / (ulong)local_ac) / (ulong)local_b0) {
    local_bc = 0;
    local_c0 = 0;
    local_c4 = 0;
    local_c8 = 0;
    local_cc = 0;
    local_d0 = 0;
    local_d4 = 0;
    local_d8 = 0;
    local_dc = 0;
    local_e0 = 0;
    local_e4 = 0;
    local_e8 = 0;
    local_f0 = &local_20->samples;
    local_f8._M_current =
         (sample *)
         std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::begin
                   ((vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> *)
                    CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    local_100 = (sample *)
                std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::
                end((vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> *)
                    CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_FormatDescriptor::sample_*,_std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>_>
                               *)in_stack_fffffffffffffcb0,
                              (__normal_iterator<const_FormatDescriptor::sample_*,_std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>_>
                               *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8)),
          bVar1) {
      local_108 = __gnu_cxx::
                  __normal_iterator<const_FormatDescriptor::sample_*,_std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>_>
                  ::operator*(&local_f8);
      bVar2 = local_108->field_0x3 & 0xf;
      if ((local_108->field_0x3 & 0xf) == 0) {
        if (local_c0 == 0) {
          local_bc = (uint)*(undefined8 *)local_108 & 0xffff;
          local_c0 = ((uint)((ulong)*(undefined8 *)local_108 >> 0x10) & 0xff) + 1;
          local_c4 = (uint)((ulong)*(undefined8 *)local_108 >> 0x20) & 0xff;
        }
        else {
          local_c8 = (uint)*(undefined8 *)local_108 & 0xffff;
          local_cc = ((uint)((ulong)*(undefined8 *)local_108 >> 0x10) & 0xff) + 1;
          local_d0 = (uint)((ulong)*(undefined8 *)local_108 >> 0x20) & 0xff;
        }
      }
      else if (bVar2 == 1) {
        local_d4 = (uint)*(undefined8 *)local_108 & 0xffff;
        local_d8 = ((uint)((ulong)*(undefined8 *)local_108 >> 0x10) & 0xff) + 1;
        local_dc = (uint)((ulong)*(undefined8 *)local_108 >> 0x20) & 0xff;
      }
      else {
        if (bVar2 != 2) {
          __assert_fail("false && \"Unsupported channel type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                        ,0x268,
                        "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                       );
        }
        local_e0 = (uint)*(undefined8 *)local_108 & 0xffff;
        local_e4 = ((uint)((ulong)*(undefined8 *)local_108 >> 0x10) & 0xff) + 1;
        local_e8 = (uint)((ulong)*(undefined8 *)local_108 >> 0x20) & 0xff;
      }
      __gnu_cxx::
      __normal_iterator<const_FormatDescriptor::sample_*,_std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>_>
      ::operator++(&local_f8);
    }
    if (local_d0 < local_c4) {
      std::swap<unsigned_int>(&local_bc,&local_c8);
      std::swap<unsigned_int>(&local_c0,&local_cc);
      std::swap<unsigned_int>(&local_c4,&local_d0);
    }
    if (local_28 != local_c0) {
      __assert_fail("precision == y0Bits",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                    ,0x272,
                    "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                   );
    }
    if (local_28 != local_cc) {
      __assert_fail("precision == y1Bits",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                    ,0x273,
                    "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                   );
    }
    if (local_28 != local_d8) {
      __assert_fail("precision == uBits",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                    ,0x274,
                    "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                   );
    }
    if (local_28 != local_e4) {
      __assert_fail("precision == vBits",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                    ,0x275,
                    "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
                   );
    }
    local_10c = (float)(local_c4 * local_ac) * 0.00390625;
    local_110 = (float)(local_d0 * local_ac) * 0.00390625;
    local_114 = (float)(local_dc * local_ac) * 0.00390625;
    local_118 = (float)(local_e8 * local_ac) * 0.00390625;
    local_11c = (float)(int)local_ac;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
               (size_type)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
    std::allocator<char>::~allocator(&local_139);
    local_140 = local_24 / local_ac;
    for (local_144 = 0; local_144 < in_stack_00000008; local_144 = local_144 + 1) {
      for (local_148 = 0; local_148 < local_140; local_148 = local_148 + 1) {
        if (local_148 == 0) {
          local_2bc = 0;
        }
        else {
          local_2bc = local_148 - 1;
        }
        local_150 = in_stack_00000010 + (ulong)((local_144 * local_140 + local_2bc) * local_a8);
        local_158 = in_stack_00000010 + (ulong)((local_144 * local_140 + local_148) * local_a8);
        if (local_148 == local_140 - 1) {
          local_2cc = local_140 - 1;
        }
        else {
          local_2cc = local_148 + 1;
        }
        local_160 = in_stack_00000010 + (ulong)((local_144 * local_140 + local_2cc) * local_a8);
        local_168 = std::vector<char,_std::allocator<char>_>::data
                              ((vector<char,_std::allocator<char>_> *)0x26f5bc);
        local_168 = local_168 + (local_144 * local_24 + local_148 * 2) * local_b4;
        local_170 = std::vector<char,_std::allocator<char>_>::data
                              ((vector<char,_std::allocator<char>_> *)0x26f5fd);
        local_170 = local_170 + (local_144 * local_24 + 1 + local_148 * 2) * local_b4;
        imageio::extract_bits<unsigned_int>
                  ((void *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                   (uint32_t)in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8);
        local_174 = imageio::convertUNORMToFloat
                              ((uint32_t)((ulong)in_stack_fffffffffffffcb0 >> 0x20),
                               (uint32_t)in_stack_fffffffffffffcb0);
        imageio::extract_bits<unsigned_int>
                  ((void *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                   (uint32_t)in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8);
        local_178 = imageio::convertUNORMToFloat
                              ((uint32_t)((ulong)in_stack_fffffffffffffcb0 >> 0x20),
                               (uint32_t)in_stack_fffffffffffffcb0);
        imageio::extract_bits<unsigned_int>
                  ((void *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                   (uint32_t)in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8);
        local_17c = imageio::convertUNORMToFloat
                              ((uint32_t)((ulong)in_stack_fffffffffffffcb0 >> 0x20),
                               (uint32_t)in_stack_fffffffffffffcb0);
        imageio::extract_bits<unsigned_int>
                  ((void *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                   (uint32_t)in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8);
        local_180 = imageio::convertUNORMToFloat
                              ((uint32_t)((ulong)in_stack_fffffffffffffcb0 >> 0x20),
                               (uint32_t)in_stack_fffffffffffffcb0);
        imageio::extract_bits<unsigned_int>
                  ((void *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                   (uint32_t)in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8);
        local_184 = imageio::convertUNORMToFloat
                              ((uint32_t)((ulong)in_stack_fffffffffffffcb0 >> 0x20),
                               (uint32_t)in_stack_fffffffffffffcb0);
        imageio::extract_bits<unsigned_int>
                  ((void *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                   (uint32_t)in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8);
        local_188 = imageio::convertUNORMToFloat
                              ((uint32_t)((ulong)in_stack_fffffffffffffcb0 >> 0x20),
                               (uint32_t)in_stack_fffffffffffffcb0);
        imageio::extract_bits<unsigned_int>
                  ((void *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                   (uint32_t)in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8);
        local_18c = imageio::convertUNORMToFloat
                              ((uint32_t)((ulong)in_stack_fffffffffffffcb0 >> 0x20),
                               (uint32_t)in_stack_fffffffffffffcb0);
        imageio::extract_bits<unsigned_int>
                  ((void *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                   (uint32_t)in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8);
        local_190 = imageio::convertUNORMToFloat
                              ((uint32_t)((ulong)in_stack_fffffffffffffcb0 >> 0x20),
                               (uint32_t)in_stack_fffffffffffffcb0);
        imageio::extract_bits<unsigned_int>
                  ((void *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                   (uint32_t)in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8);
        in_stack_fffffffffffffce4 =
             imageio::convertUNORMToFloat
                       ((uint32_t)((ulong)in_stack_fffffffffffffcb0 >> 0x20),
                        (uint32_t)in_stack_fffffffffffffcb0);
        local_194 = in_stack_fffffffffffffce4;
        in_stack_fffffffffffffce0 =
             imageio::extract_bits<unsigned_int>
                       ((void *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                        (uint32_t)in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8);
        in_stack_fffffffffffffcdc =
             imageio::convertUNORMToFloat
                       ((uint32_t)((ulong)in_stack_fffffffffffffcb0 >> 0x20),
                        (uint32_t)in_stack_fffffffffffffcb0);
        local_240 = &local_19a;
        local_238 = &local_118;
        local_230 = &local_11c;
        local_228 = &local_17c;
        local_220 = &local_18c;
        local_218 = &local_198;
        local_210 = &local_d8;
        local_208 = &local_199;
        local_200 = &local_110;
        local_1f8 = &local_174;
        local_1f0 = &local_10c;
        local_1e8 = &local_180;
        local_1e0 = &local_184;
        local_1d8 = &local_190;
        local_1d0 = &local_c0;
        local_1c8 = &local_114;
        local_1c0 = &local_178;
        local_1b8 = &local_188;
        local_1b0 = &local_194;
        local_1a8 = &local_b8;
        local_198 = in_stack_fffffffffffffcdc;
        unpackAndSave422(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,char_const*,unsigned_long)
        ::$_0::operator()((anon_class_160_20_da61d305 *)
                          CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                          (char *)in_stack_fffffffffffffcc8,
                          (float)((ulong)in_stack_fffffffffffffcc0 >> 0x20));
        unpackAndSave422(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,char_const*,unsigned_long)
        ::$_0::operator()((anon_class_160_20_da61d305 *)
                          CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                          (char *)in_stack_fffffffffffffcc8,
                          (float)((ulong)in_stack_fffffffffffffcc0 >> 0x20));
      }
    }
    std::__cxx11::string::string(local_260,in_RSI);
    this_01 = &local_138;
    this_00 = (FormatDescriptor *)
              std::vector<char,_std::allocator<char>_>::data
                        ((vector<char,_std::allocator<char>_> *)0x26fb40);
    std::vector<char,_std::allocator<char>_>::size(this_01);
    savePNG(_valueU,_valueRightY0,valueRightU._3_1_,(VkFormat)valueRightV,in_stack_000001b8,
            setPixel.channelBytes._4_4_,(uint32_t)valueLeftU,pixel1,(size_t)pixel0);
    std::__cxx11::string::~string(local_260);
    std::vector<char,_std::allocator<char>_>::~vector(this_01);
    FormatDescriptor::~FormatDescriptor(this_00);
    return;
  }
  __assert_fail("size == width * height * blockYUVBytes / blockDimensionX / blockDimensionY",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                ,0x23f,
                "void ktx::CommandExtract::unpackAndSave422(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const char *, std::size_t)"
               );
}

Assistant:

void CommandExtract::unpackAndSave422(std::string filepath, bool appendExtension,
        VkFormat vkFormat, const FormatDescriptor& format, uint32_t width, uint32_t height,
        const char* data, std::size_t size) {
    (void) vkFormat;

    assert(format.model() == KHR_DF_MODEL_YUVSDA);
    assert(format.find(KHR_DF_CHANNEL_YUVSDA_Y));
    // Create a custom format with the same precision but with only 3 channels
    // Reuse similar 4 channel VkFormats and drop the last channel (There is no RGB variant of 10X6 and 12X4)
    const auto precision = format.find(KHR_DF_CHANNEL_YUVSDA_Y)->bitLength + 1u;
    auto unpackedFormat = createFormatDescriptor(
            precision == 8 ? VK_FORMAT_R8G8B8A8_UNORM :
            precision == 10 ? VK_FORMAT_R10X6G10X6B10X6A10X6_UNORM_4PACK16 :
            precision == 12 ? VK_FORMAT_R12X4G12X4B12X4A12X4_UNORM_4PACK16 :
            precision == 16 ? VK_FORMAT_R16G16B16A16_UNORM :
            VK_FORMAT_UNDEFINED, *this);
    unpackedFormat.removeLastChannel();

    // 1 pixel (block) with 4 channel is unpacked to 2 pixel with 3 channels: Y0,Y1,U,V -> R0,G0,B0,R1,G1,B1
    const auto blockYUVBytes = format.pixelByteCount();
    const auto blockDimensionX = format.basic.texelBlockDimension0 + 1;
    const auto blockDimensionY = format.basic.texelBlockDimension1 + 1;
    const auto pixelBytes = unpackedFormat.pixelByteCount();
    const auto channelBytes = pixelBytes / 3;
    assert(format.sampleCount() == 4);
    assert(format.basic.texelBlockDimension0 + 1 == 2);
    assert(format.basic.texelBlockDimension1 + 1 == 1);
    assert(format.basic.texelBlockDimension2 + 1 == 1);
    assert(format.basic.texelBlockDimension3 + 1 == 1);
    assert(size == width * height * blockYUVBytes / blockDimensionX / blockDimensionY);
    (void) size;
    (void) blockDimensionY;

    uint32_t y0Offset = 0;
    uint32_t y0Bits = 0;
    uint32_t y0PositionX = 0;
    uint32_t y1Offset = 0;
    uint32_t y1Bits = 0;
    uint32_t y1PositionX = 0;
    uint32_t uOffset = 0;
    uint32_t uBits = 0;
    uint32_t uPositionX = 0;
    uint32_t vOffset = 0;
    uint32_t vBits = 0;
    uint32_t vPositionX = 0;

    for (const auto& sample : format.samples) {
        switch (sample.channelType) {
        case KHR_DF_CHANNEL_YUVSDA_Y:
            if (y0Bits != 0) {
                y1Offset = sample.bitOffset;
                y1Bits = sample.bitLength + 1;
                y1PositionX = sample.samplePosition0;
            } else {
                y0Offset = sample.bitOffset;
                y0Bits = sample.bitLength + 1;
                y0PositionX = sample.samplePosition0;
            }
            break;
        case KHR_DF_CHANNEL_YUVSDA_U:
            uOffset = sample.bitOffset;
            uBits = sample.bitLength + 1;
            uPositionX = sample.samplePosition0;
            break;
        case KHR_DF_CHANNEL_YUVSDA_V:
            vOffset = sample.bitOffset;
            vBits = sample.bitLength + 1;
            vPositionX = sample.samplePosition0;
            break;
        default:
            assert(false && "Unsupported channel type");
        }
    }
    if (y0PositionX > y1PositionX) {
        // Ensure that y0 (as we refer to) is the left sample
        std::swap(y0Offset, y1Offset);
        std::swap(y0Bits, y1Bits);
        std::swap(y0PositionX, y1PositionX);
    }

    assert(precision == y0Bits);
    assert(precision == y1Bits);
    assert(precision == uBits);
    assert(precision == vBits);

    const float positionY0 = static_cast<float>(y0PositionX * blockDimensionX) / 256.f;
    const float positionY1 = static_cast<float>(y1PositionX * blockDimensionX) / 256.f;
    const float positionU = static_cast<float>(uPositionX * blockDimensionX) / 256.f;
    const float positionV = static_cast<float>(vPositionX * blockDimensionX) / 256.f;
    const float blockSize = static_cast<float>(blockDimensionX);

    std::vector<char> unpackedData(width * height * pixelBytes);

    const auto blockCountX = width / blockDimensionX;
    for (uint32_t y = 0; y < height; y++) {
        for (uint32_t x = 0; x < blockCountX; x++) {
            const char* rawYUVBlockLeft = data + (y * blockCountX + (x == 0 ? 0 : x - 1)) * blockYUVBytes;
            const char* rawYUVBlock = data + (y * blockCountX + x) * blockYUVBytes;
            const char* rawYUVBlockRight = data + (y * blockCountX + (x == blockCountX - 1 ? blockCountX - 1 : x + 1)) * blockYUVBytes;

            char* pixel0 = unpackedData.data() + (y * width + x * 2) * pixelBytes;
            char* pixel1 = unpackedData.data() + (y * width + x * 2 + 1) * pixelBytes;

            const float valueLeftY1 = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlockLeft, y1Offset, y1Bits), y1Bits);
            const float valueLeftU = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlockLeft, uOffset, uBits), uBits);
            const float valueLeftV = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlockLeft, vOffset, vBits), vBits);
            const float valueY0 = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlock, y0Offset, y0Bits), y0Bits);
            const float valueY1 = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlock, y1Offset, y1Bits), y1Bits);
            const float valueU = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlock, uOffset, uBits), uBits);
            const float valueV = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlock, vOffset, vBits), vBits);
            const float valueRightY0 = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlockRight, y0Offset, y0Bits), y0Bits);
            const float valueRightU = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlockRight, uOffset, uBits), uBits);
            const float valueRightV = convertUNORMToFloat(extract_bits<uint32_t>(rawYUVBlockRight, vOffset, vBits), vBits);

            const auto interpolateY = [](float pos, float pos0, float value0, float pos1, float value1, float pos2, float value2, float pos3, float value3) {
                if (pos < pos1)
                    return remap(pos, pos0, pos1, value0, value1);
                else if (pos < pos2)
                    return remap(pos, pos1, pos2, value1, value2);
                else
                    return remap(pos, pos2, pos3, value2, value3);
            };

            const auto interpolateUV = [](float pos, float pos0, float value0, float pos1, float value1, float pos2, float value2) {
                if (pos < pos1)
                    return remap(pos, pos0, pos1, value0, value1);
                else
                    return remap(pos, pos1, pos2, value1, value2);
            };

            const auto setPixel = [&](auto* pixel, float pos) {
                const auto r = convertFloatToUNORM(interpolateUV(pos,
                        positionV - blockSize, valueLeftV,
                        positionV, valueV,
                        positionV + blockSize, valueRightV), uBits);
                const auto g = convertFloatToUNORM(interpolateY(
                        pos,
                        positionY1 - blockSize, valueLeftY1,
                        positionY0, valueY0,
                        positionY1, valueY1,
                        positionY0 + blockSize, valueRightY0), y0Bits);
                const auto b = convertFloatToUNORM(interpolateUV(pos,
                        positionU - blockSize, valueLeftU,
                        positionU, valueU,
                        positionU + blockSize, valueRightU), uBits);

                const auto offsetToUsedBytes = is_big_endian ? sizeof(r) - channelBytes : 0u;
                std::memcpy(pixel + 0 * channelBytes, &r + offsetToUsedBytes, channelBytes);
                std::memcpy(pixel + 1 * channelBytes, &g + offsetToUsedBytes, channelBytes);
                std::memcpy(pixel + 2 * channelBytes, &b + offsetToUsedBytes, channelBytes);
            };

            setPixel(pixel0, 0.5f);
            setPixel(pixel1, 1.5f);
        }
    }

    // Save unpacked data as RGBSDA with the custom format
    savePNG(filepath, appendExtension, VK_FORMAT_UNDEFINED, unpackedFormat, width, height,
            reinterpret_cast<const char*>(unpackedData.data()),
            unpackedData.size() * sizeof(decltype(unpackedData)::value_type));
}